

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Epoll.cpp
# Opt level: O1

void __thiscall gnl::Epoll::~Epoll(Epoll *this)

{
  pointer peVar1;
  
  if (this->mEpollfd != -1) {
    close(this->mEpollfd);
  }
  peVar1 = (this->events).super__Vector_base<epoll_event,_std::allocator<epoll_event>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (peVar1 != (pointer)0x0) {
    operator_delete(peVar1);
    return;
  }
  return;
}

Assistant:

Epoll::~Epoll() {
    this->close();
}